

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O3

void __thiscall
cppnet::TimerContainer::GetIndexTimer
          (TimerContainer *this,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *run_timer_solts,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *sub_timer_solts,uint32_t index,uint32_t time_pass)

{
  unordered_map<unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>_>
  *this_00;
  int *piVar1;
  _Atomic_word *p_Var2;
  int iVar3;
  __weak_count<(__gnu_cxx::_Lock_policy)2> this_01;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  _Self __tmp;
  _Base_ptr p_Var6;
  bool bVar7;
  weak_ptr<cppnet::TimerSlot> local_78;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
  local_60;
  TimerContainer *local_58;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
  *local_48;
  _Rb_tree_node_base *local_40;
  uint32_t local_34;
  
  this_00 = &this->_timer_wheel;
  local_48 = (vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
              *)run_timer_solts;
  local_34 = index;
  local_60._M_cur =
       (__node_type *)
       std::
       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find(&this_00->_M_h,&local_34);
  if (local_60._M_cur != (__node_type *)0x0) {
    p_Var5 = *(_Rb_tree_node_base **)((long)local_60._M_cur + 0x28);
    local_40 = (_Rb_tree_node_base *)((long)local_60._M_cur + 0x18);
    local_58 = this;
    local_50 = &this_00->_M_h;
    if (p_Var5 != local_40) {
      do {
        if (time_pass < p_Var5[1]._M_color) {
          for (p_Var6 = p_Var5[1]._M_parent; p_Var6 != (_Base_ptr)&p_Var5[1]._M_parent;
              p_Var6 = *(_Base_ptr *)p_Var6) {
            local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6->_M_right;
            if ((_Base_ptr)
                local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi == (_Base_ptr)0x0) {
LAB_00113db7:
              local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              bVar7 = true;
            }
            else {
              iVar4 = *(int *)&((_Base_ptr)
                               local_78.
                               super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_M_parent;
              do {
                if (iVar4 == 0) goto LAB_00113db7;
                LOCK();
                iVar3 = *(int *)&((_Base_ptr)
                                 local_78.
                                 super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_parent;
                bVar7 = iVar4 == iVar3;
                if (bVar7) {
                  *(int *)&((_Base_ptr)
                           local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_parent = iVar4 + 1;
                  iVar3 = iVar4;
                }
                iVar4 = iVar3;
                UNLOCK();
              } while (!bVar7);
              if (*(int *)&((_Base_ptr)
                           local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_parent == 0) {
                local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
              }
              else {
                local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)p_Var6->_M_left;
              }
              if (__libc_single_threaded == '\0') {
                LOCK();
                piVar1 = (int *)((long)&((_Base_ptr)
                                        local_78.
                                        super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_parent + 4);
                *piVar1 = *piVar1 + 1;
                UNLOCK();
              }
              else {
                piVar1 = (int *)((long)&((_Base_ptr)
                                        local_78.
                                        super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_parent + 4);
                *piVar1 = *piVar1 + 1;
              }
              bVar7 = false;
            }
            this_01._M_pi =
                 local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            std::
            vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
            ::emplace_back<std::weak_ptr<cppnet::TimerSlot>>
                      ((vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
                        *)sub_timer_solts,&local_78);
            if ((_Base_ptr)
                local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2 = &(local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_weak_count;
                iVar4 = *p_Var2;
                *p_Var2 = *p_Var2 + -1;
                UNLOCK();
              }
              else {
                iVar4 = (local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_weak_count;
                (local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count = iVar4 + -1;
              }
              if (iVar4 == 1) {
                (*(local_78.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
              }
            }
            if (!bVar7) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
            }
          }
        }
        else {
          std::
          vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
          ::_M_range_insert<std::_List_iterator<std::weak_ptr<cppnet::TimerSlot>>>
                    (local_48,*(undefined8 *)(local_48 + 8),p_Var5[1]._M_parent,&p_Var5[1]._M_parent
                    );
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != local_40);
    }
    Bitmap::Remove(&local_58->_bitmap,local_58->_cur_time);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(local_50,(const_iterator)local_60._M_cur);
  }
  return;
}

Assistant:

void TimerContainer::GetIndexTimer(std::vector<std::weak_ptr<TimerSlot>>& run_timer_solts, 
    std::vector<std::weak_ptr<TimerSlot>>& sub_timer_solts, uint32_t index, uint32_t time_pass) {
    auto bucket_iter = _timer_wheel.find(index);
    if (bucket_iter == _timer_wheel.end()) {
        return;
    }
    auto& bucket = bucket_iter->second;

    for (auto timer_list = bucket.begin(); timer_list != bucket.end(); timer_list++) {
        if (timer_list->first == 0) {
            run_timer_solts.insert(run_timer_solts.end(), timer_list->second.begin(), timer_list->second.end());
            continue;
        }

        if (timer_list->first <= time_pass) {
            run_timer_solts.insert(run_timer_solts.end(), timer_list->second.begin(), timer_list->second.end());
            continue;
        }

        for (auto timer = timer_list->second.begin(); timer != timer_list->second.end(); timer++) {
            auto target = timer->lock();
            sub_timer_solts.push_back(target);
        }
    }

    _bitmap.Remove(_cur_time);
    _timer_wheel.erase(bucket_iter);
}